

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GLES2ShaderSharingTest::renderResource
          (GLES2ShaderSharingTest *this,Surface *screen,Surface *reference)

{
  glReadPixelsFunc p_Var1;
  GLuint GVar2;
  GLenum GVar3;
  GLuint GVar4;
  int iVar5;
  MessageBuilder *pMVar6;
  size_t sVar7;
  TestError *this_00;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  char *msg;
  uint uVar12;
  int iVar13;
  void *pvVar14;
  int iVar15;
  uint uVar16;
  int i;
  uint uVar17;
  long lVar18;
  uint uVar19;
  float fVar20;
  float t;
  float fVar21;
  Vector<float,_4> res_4;
  char *fragmentShader;
  char *vertexShader;
  GLint status;
  Vector<float,_4> res_3;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  Vector<float,_4> res_2;
  Vec4 c;
  Vec4 d;
  Vec4 a;
  char buffer [256];
  float local_348 [4];
  char *local_338;
  char *local_330;
  GLsizei local_324;
  GLsizei local_320;
  GLint local_31c;
  float local_318 [22];
  undefined1 *puStack_2c0;
  undefined1 local_2b8 [8];
  _func_int **pp_Stack_2b0;
  void *local_298;
  ios_base local_240 [264];
  IVec4 local_138 [16];
  
  local_330 = 
  "attribute mediump vec2 a_pos;\nattribute mediump vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main(void)\n{\n\tv_color = a_color;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
  ;
  local_338 = "varying mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_FragColor = v_color;\n}\n";
  if (this->m_shaderType == 0x8b30) {
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.createShader)(0x8b31);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"glCreateShader()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x391);
    (*(this->super_GLES2SharingTest).m_gl.shaderSource)(GVar2,1,&local_330,(GLint *)0x0);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    msg = "shaderSource(otherShader, 1, &vertexShader, DE_NULL)";
    iVar5 = 0x392;
LAB_00dfe7e1:
    glu::checkError(GVar3,msg,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,iVar5);
  }
  else {
    GVar2 = 0xffffffff;
    if (this->m_shaderType == 0x8b31) {
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.createShader)(0x8b30);
      GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar3,"glCreateShader()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x38b);
      (*(this->super_GLES2SharingTest).m_gl.shaderSource)(GVar2,1,&local_338,(GLint *)0x0);
      GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      msg = "shaderSource(otherShader, 1, &fragmentShader, DE_NULL)";
      iVar5 = 0x38c;
      goto LAB_00dfe7e1;
    }
  }
  (*(this->super_GLES2SharingTest).m_gl.compileShader)(GVar2);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"compileShader(otherShader)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x399);
  local_31c = 0;
  (*(this->super_GLES2SharingTest).m_gl.getShaderiv)(GVar2,0x8b81,&local_31c);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"getShaderiv(otherShader, GL_COMPILE_STATUS, &status)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x39c);
  if (local_31c != 0) {
    GVar4 = (*(this->super_GLES2SharingTest).m_gl.createProgram)();
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"glCreateProgram()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3b8);
    (*(this->super_GLES2SharingTest).m_gl.attachShader)(GVar4,this->m_shader);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"attachShader(program, m_shader)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3ba);
    (*(this->super_GLES2SharingTest).m_gl.attachShader)(GVar4,GVar2);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"attachShader(program, otherShader)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3bb);
    (*(this->super_GLES2SharingTest).m_gl.linkProgram)(GVar4);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"linkProgram(program)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3bd);
    (*(this->super_GLES2SharingTest).m_gl.deleteShader)(GVar2);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"deleteShader(otherShader)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3be);
    local_31c = 0;
    (*(this->super_GLES2SharingTest).m_gl.getProgramiv)(GVar4,0x8b82,&local_31c);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"getProgramiv(program, GL_LINK_STATUS, &status)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3c1);
    if (local_31c == 0) {
      (*(this->super_GLES2SharingTest).m_gl.getProgramInfoLog)
                (GVar4,0x100,(GLsizei *)0x0,(GLchar *)local_138);
      GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar3,"getProgramInfoLog(program, 256, DE_NULL, buffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3c6);
      local_2b8 = (undefined1  [8])(this->super_GLES2SharingTest).m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_2b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_2b0,"Failed to link program",0x16);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_2b0);
      std::ios_base::~ios_base(local_240);
      local_2b8 = (undefined1  [8])(this->super_GLES2SharingTest).m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_2b0);
      pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_2b8,&local_330);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_2b0);
      std::ios_base::~ios_base(local_240);
      local_2b8 = (undefined1  [8])(this->super_GLES2SharingTest).m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_2b0);
      pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_2b8,&local_338);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_2b0);
      std::ios_base::~ios_base(local_240);
      local_2b8 = (undefined1  [8])(this->super_GLES2SharingTest).m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_2b0);
      sVar7 = strlen((char *)local_138);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_2b0,(char *)local_138,sVar7);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_2b0);
      std::ios_base::~ios_base(local_240);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Failed to link program",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                 ,0x3cd);
    }
    else {
      if (screen == (Surface *)0x0) {
        local_324 = 0xf0;
        local_320 = 0xf0;
      }
      else {
        local_320 = screen->m_width;
        local_324 = screen->m_height;
      }
      (*(this->super_GLES2SharingTest).m_gl.viewport)(0,0,local_320,local_324);
      GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar3,"viewport(0, 0, width, height)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3e9);
      (*(this->super_GLES2SharingTest).m_gl.clearColor)(1.0,0.0,0.0,1.0);
      GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar3,"clearColor(1.0f, 0.0f, 0.0f, 1.0f)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3eb);
      (*(this->super_GLES2SharingTest).m_gl.clear)(0x4000);
      GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar3,"clear(GL_COLOR_BUFFER_BIT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3ec);
      (*(this->super_GLES2SharingTest).m_gl.useProgram)(GVar4);
      GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar3,"useProgram(program)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3ee);
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)(GVar4,"a_pos");
      GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar3,"glGetAttribLocation()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3f1);
      if (GVar2 == 0xffffffff) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"coordLocation != (GLuint)-1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                   ,0x3f2);
      }
      else {
        GVar4 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)(GVar4,"a_color");
        GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
        glu::checkError(GVar3,"glGetAttribLocation()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                        ,0x3f5);
        if (GVar4 != 0xffffffff) {
          (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar4);
          GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar3,"enableVertexAttribArray(colorLocation)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x3f8);
          (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar2);
          GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar3,"enableVertexAttribArray(coordLocation)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x3f9);
          (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                    (GVar4,4,0x1406,'\0',0,renderResource::colors);
          GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar3,
                          "vertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, colors)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x3fb);
          (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                    (GVar2,2,0x1406,'\0',0,renderResource::coords);
          GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar3,
                          "vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x3fc);
          (*(this->super_GLES2SharingTest).m_gl.drawElements)(4,6,0x1403,renderResource::indices);
          GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar3,"drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x3fe);
          (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar2);
          GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar3,"disableVertexAttribArray(coordLocation)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x3ff);
          (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar4);
          GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar3,"disableVertexAttribArray(colorLocation)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x400);
          (*(this->super_GLES2SharingTest).m_gl.useProgram)(0);
          GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar3,"useProgram(0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x401);
          if (screen != (Surface *)0x0) {
            p_Var1 = (this->super_GLES2SharingTest).m_gl.readPixels;
            iVar5 = screen->m_width;
            iVar8 = screen->m_height;
            local_138[0].m_data[0] = RGBA;
            local_138[0].m_data[1] = UNORM_INT8;
            pvVar14 = (void *)(screen->m_pixels).m_cap;
            if (pvVar14 != (void *)0x0) {
              pvVar14 = (screen->m_pixels).m_ptr;
            }
            tcu::PixelBufferAccess::PixelBufferAccess
                      ((PixelBufferAccess *)local_2b8,(TextureFormat *)local_138,iVar5,iVar8,1,
                       pvVar14);
            (*p_Var1)(0,0,iVar5,iVar8,0x1908,0x1401,local_298);
            local_138[0].m_data[0] = RGBA;
            local_138[0].m_data[1] = UNORM_INT8;
            pvVar14 = (void *)(reference->m_pixels).m_cap;
            if (pvVar14 != (void *)0x0) {
              pvVar14 = (reference->m_pixels).m_ptr;
            }
            tcu::PixelBufferAccess::PixelBufferAccess
                      ((PixelBufferAccess *)local_2b8,(TextureFormat *)local_138,reference->m_width,
                       reference->m_height,1,pvVar14);
            local_138[0].m_data[0] = 0xff;
            local_138[0].m_data[1] = SNORM_INT8;
            local_138[0].m_data[2] = 0;
            local_138[0].m_data[3] = 0xff;
            tcu::clear((PixelBufferAccess *)local_2b8,local_138);
            fVar20 = (float)local_320 * 0.5;
            iVar5 = (int)(fVar20 * -0.9 + fVar20);
            iVar8 = (int)(fVar20 * 0.9 + fVar20);
            if (iVar5 <= iVar8) {
              fVar20 = (float)local_324 * 0.5;
              iVar9 = (int)(fVar20 * -0.9 + fVar20);
              iVar11 = (int)(fVar20 * 0.9 + fVar20);
              uVar12 = 0;
              iVar13 = iVar5;
              do {
                if (iVar9 <= iVar11) {
                  fVar20 = (float)(iVar13 - iVar5) / (float)(iVar8 - iVar5);
                  pvVar14 = (reference->m_pixels).m_ptr;
                  iVar15 = iVar9;
                  do {
                    fVar21 = (float)(iVar15 - iVar9) / (float)(iVar11 - iVar9);
                    local_2b8 = (undefined1  [8])0;
                    pp_Stack_2b0 = (_func_int **)0x3f80000000000000;
                    local_138[0].m_data[0] = 0x3f800000;
                    local_138[0].m_data[1] = SNORM_INT8;
                    local_138[0].m_data[2] = 0;
                    local_138[0].m_data[3] = 0x3f800000;
                    local_318[0x10] = 0.0;
                    local_318[0x11] = 1.0;
                    local_318[0x12] = 0.0;
                    local_318[0x13] = 1.0;
                    local_318[0x14] = 0.0;
                    local_318[0x15] = 0.0;
                    puStack_2c0 = &DAT_3f8000003f800000;
                    if (fVar20 <= fVar21) {
                      local_318[8] = 0.0;
                      local_318[9] = 0.0;
                      local_318[10] = 0.0;
                      local_318[0xb] = 0.0;
                      lVar18 = 0;
                      do {
                        local_318[lVar18 + 8] = *(float *)(local_2b8 + lVar18 * 4) * (1.0 - fVar21);
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != 4);
                      local_318[4] = 0.0;
                      local_318[5] = 0.0;
                      local_318[6] = 0.0;
                      local_318[7] = 0.0;
                      lVar18 = 0;
                      do {
                        local_318[lVar18 + 4] = local_318[lVar18 + 0x14] * (fVar21 - fVar20);
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != 4);
                      local_318[0xc] = 0.0;
                      local_318[0xd] = 0.0;
                      local_318[0xe] = 0.0;
                      local_318[0xf] = 0.0;
                      lVar18 = 0;
                      do {
                        local_318[lVar18 + 0xc] = local_318[lVar18 + 8] + local_318[lVar18 + 4];
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != 4);
                      local_318[0] = 0.0;
                      local_318[1] = 0.0;
                      local_318[2] = 0.0;
                      local_318[3] = 0.0;
                      lVar18 = 0;
                      do {
                        local_318[lVar18] = local_318[lVar18 + 0x10] * fVar20;
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != 4);
                      local_348[0] = 0.0;
                      local_348[1] = 0.0;
                      local_348[2] = 0.0;
                      local_348[3] = 0.0;
                      lVar18 = 0;
                      do {
                        local_348[lVar18] = local_318[lVar18 + 0xc] + local_318[lVar18];
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != 4);
                    }
                    else {
                      local_318[8] = 0.0;
                      local_318[9] = 0.0;
                      local_318[10] = 0.0;
                      local_318[0xb] = 0.0;
                      lVar18 = 0;
                      do {
                        local_318[lVar18 + 8] = *(float *)(local_2b8 + lVar18 * 4) * (1.0 - fVar20);
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != 4);
                      local_318[4] = 0.0;
                      local_318[5] = 0.0;
                      local_318[6] = 0.0;
                      local_318[7] = 0.0;
                      lVar18 = 0;
                      do {
                        local_318[lVar18 + 4] =
                             (float)local_138[0].m_data[lVar18] * (fVar20 - fVar21);
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != 4);
                      local_318[0xc] = 0.0;
                      local_318[0xd] = 0.0;
                      local_318[0xe] = 0.0;
                      local_318[0xf] = 0.0;
                      lVar18 = 0;
                      do {
                        local_318[lVar18 + 0xc] = local_318[lVar18 + 8] + local_318[lVar18 + 4];
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != 4);
                      local_318[0] = 0.0;
                      local_318[1] = 0.0;
                      local_318[2] = 0.0;
                      local_318[3] = 0.0;
                      lVar18 = 0;
                      do {
                        local_318[lVar18] = local_318[lVar18 + 0x10] * fVar21;
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != 4);
                      local_348[0] = 0.0;
                      local_348[1] = 0.0;
                      local_348[2] = 0.0;
                      local_348[3] = 0.0;
                      lVar18 = 0;
                      do {
                        local_348[lVar18] = local_318[lVar18 + 0xc] + local_318[lVar18];
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != 4);
                    }
                    uVar10 = (uint)(local_348[0] * 255.0);
                    if (0xfe < (int)uVar10) {
                      uVar10 = 0xff;
                    }
                    if ((int)uVar10 < 1) {
                      uVar10 = uVar12;
                    }
                    uVar17 = (uint)(local_348[1] * 255.0);
                    if (0xfe < (int)uVar17) {
                      uVar17 = 0xff;
                    }
                    if ((int)uVar17 < 1) {
                      uVar17 = uVar12;
                    }
                    uVar19 = (uint)(local_348[2] * 255.0);
                    if (0xfe < (int)uVar19) {
                      uVar19 = 0xff;
                    }
                    if ((int)uVar19 < 1) {
                      uVar19 = uVar12;
                    }
                    uVar16 = (uint)(local_348[3] * 255.0);
                    if (0xfe < (int)uVar16) {
                      uVar16 = 0xff;
                    }
                    if ((int)uVar16 < 1) {
                      uVar16 = uVar12;
                    }
                    *(uint *)((long)pvVar14 + (long)(reference->m_width * iVar15 + iVar13) * 4) =
                         uVar19 << 0x10 | uVar17 << 8 | uVar16 << 0x18 | uVar10;
                    iVar15 = iVar15 + 1;
                  } while (iVar15 <= iVar11);
                }
                iVar13 = iVar13 + 1;
              } while (iVar13 <= iVar8);
            }
          }
          return;
        }
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"colorLocation != (GLuint)-1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                   ,0x3f6);
      }
    }
    goto LAB_00dff3cc;
  }
  (*(this->super_GLES2SharingTest).m_gl.getShaderInfoLog)
            (GVar2,0x100,(GLsizei *)0x0,(GLchar *)local_138);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"getShaderInfoLog(otherShader, 256, DE_NULL, buffer)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x3a1);
  local_2b8 = (undefined1  [8])(this->super_GLES2SharingTest).m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_2b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_2b0,"Failed to compile shader",0x18);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_2b0);
  std::ios_base::~ios_base(local_240);
  if (this->m_shaderType == 0x8b30) {
    local_2b8 = (undefined1  [8])(this->super_GLES2SharingTest).m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_2b0);
    pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_2b8,&local_330);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00dff41e:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_2b0);
    std::ios_base::~ios_base(local_240);
  }
  else if (this->m_shaderType == 0x8b31) {
    local_2b8 = (undefined1  [8])(this->super_GLES2SharingTest).m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_2b0);
    pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_2b8,&local_338);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    goto LAB_00dff41e;
  }
  local_2b8 = (undefined1  [8])(this->super_GLES2SharingTest).m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_2b0);
  sVar7 = strlen((char *)local_138);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_2b0,(char *)local_138,sVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_2b0);
  std::ios_base::~ios_base(local_240);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Failed to compile shader",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
             ,0x3b4);
LAB_00dff3cc:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GLES2ShaderSharingTest::renderResource (tcu::Surface* screen, tcu::Surface* reference)
{
	DE_ASSERT((screen && reference) || (!screen && !reference));

	int width = 240;
	int height = 240;

	const char* vertexShader = ""
	"attribute mediump vec2 a_pos;\n"
	"attribute mediump vec4 a_color;\n"
	"varying mediump vec4 v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tv_color = a_color;\n"
	"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
	"}\n";

	const char* fragmentShader = ""
	"varying mediump vec4 v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tgl_FragColor = v_color;\n"
	"}\n";


	GLuint otherShader = (GLuint)-1;

	switch (m_shaderType)
	{
		case GL_VERTEX_SHADER:
			otherShader = m_gl.createShader(GL_FRAGMENT_SHADER);
			GLU_CHECK_GLW_MSG(m_gl, "glCreateShader()");
			GLU_CHECK_GLW_CALL(m_gl, shaderSource(otherShader, 1, &fragmentShader, DE_NULL));
			break;

		case GL_FRAGMENT_SHADER:
			otherShader = m_gl.createShader(GL_VERTEX_SHADER);
			GLU_CHECK_GLW_MSG(m_gl, "glCreateShader()");
			GLU_CHECK_GLW_CALL(m_gl, shaderSource(otherShader, 1, &vertexShader, DE_NULL));
			break;

		default:
			DE_ASSERT(false);
	}

	GLU_CHECK_GLW_CALL(m_gl, compileShader(otherShader));

	GLint status = 0;
	GLU_CHECK_GLW_CALL(m_gl, getShaderiv(otherShader, GL_COMPILE_STATUS, &status));

	if (!status)
	{
		char buffer[256];
		GLU_CHECK_GLW_CALL(m_gl, getShaderInfoLog(otherShader, 256, DE_NULL, buffer));

		m_log << tcu::TestLog::Message << "Failed to compile shader" << tcu::TestLog::EndMessage;

		switch (m_shaderType)
		{
			case GL_FRAGMENT_SHADER:
				m_log << tcu::TestLog::Message << vertexShader << tcu::TestLog::EndMessage;
				break;

			case GL_VERTEX_SHADER:
				m_log << tcu::TestLog::Message << fragmentShader << tcu::TestLog::EndMessage;
				break;

			default:
				DE_ASSERT(false);
		}

		m_log << tcu::TestLog::Message << buffer << tcu::TestLog::EndMessage;
		TCU_FAIL("Failed to compile shader");
	}

	GLuint program = m_gl.createProgram();
	GLU_CHECK_GLW_MSG(m_gl, "glCreateProgram()");

	GLU_CHECK_GLW_CALL(m_gl, attachShader(program, m_shader));
	GLU_CHECK_GLW_CALL(m_gl, attachShader(program, otherShader));

	GLU_CHECK_GLW_CALL(m_gl, linkProgram(program));
	GLU_CHECK_GLW_CALL(m_gl, deleteShader(otherShader));

	status = 0;
	GLU_CHECK_GLW_CALL(m_gl, getProgramiv(program, GL_LINK_STATUS, &status));

	if (!status)
	{
		char buffer[256];
		GLU_CHECK_GLW_CALL(m_gl, getProgramInfoLog(program, 256, DE_NULL, buffer));

		m_log << tcu::TestLog::Message << "Failed to link program" << tcu::TestLog::EndMessage;

		m_log << tcu::TestLog::Message << vertexShader << tcu::TestLog::EndMessage;
		m_log << tcu::TestLog::Message << fragmentShader << tcu::TestLog::EndMessage;
		m_log << tcu::TestLog::Message << buffer << tcu::TestLog::EndMessage;
		TCU_FAIL("Failed to link program");
	}

	if (screen)
	{
		width = screen->getWidth();
		height = screen->getHeight();
	}

	static const GLfloat coords[] = {
		-0.9f, -0.9f,
		 0.9f, -0.9f,
		 0.9f,  0.9f,
		-0.9f,  0.9f
	};

	static const GLfloat colors [] = {
		0.0f, 0.0f, 0.0f, 1.0f,
		1.0f, 0.0f, 0.0f, 1.0f,
		0.0f, 1.0f, 0.0f, 1.0f,
		0.0f, 0.0f, 1.0f, 1.0f
	};

	static const GLushort indices[] = {
		0, 1, 2,
		2, 3, 0
	};

	GLU_CHECK_GLW_CALL(m_gl, viewport(0, 0, width, height));

	GLU_CHECK_GLW_CALL(m_gl, clearColor(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_GLW_CALL(m_gl, clear(GL_COLOR_BUFFER_BIT));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program));

	GLuint coordLocation = m_gl.getAttribLocation(program, "a_pos");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(coordLocation != (GLuint)-1);

	GLuint colorLocation = m_gl.getAttribLocation(program, "a_color");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(colorLocation != (GLuint)-1);

	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(coordLocation));

	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, colors));
	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords));

	GLU_CHECK_GLW_CALL(m_gl, drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(coordLocation));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, useProgram(0));

	if (screen)
	{
		m_gl.readPixels(0, 0, screen->getWidth(), screen->getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen->getAccess().getDataPtr());

		tcu::clear(reference->getAccess(), tcu::IVec4(0xff, 0, 0, 0xff));

		int x1 = (int)(((float)width/2.0f)  * (-0.9f) + ((float)width/2.0f));
		int x2 = (int)(((float)width/2.0f)  *   0.9f  + ((float)width/2.0f));
		int y1 = (int)(((float)height/2.0f) * (-0.9f) + ((float)height/2.0f));
		int y2 = (int)(((float)height/2.0f) *   0.9f  + ((float)height/2.0f));

		for (int x = x1; x <= x2; x++)
		{
			for (int y = y1; y <= y2; y++)
			{
				float t = ((float)(x-x1) / (float)(x2-x1));
				float s = ((float)(y-y1) / (float)(y2-y1));
				bool isUpper = t > s;

				tcu::Vec4 a(colors[0],		colors[1],		colors[2],		colors[3]);
				tcu::Vec4 b(colors[4 + 0],	colors[4 + 1],	colors[4 + 2],	colors[4 + 3]);
				tcu::Vec4 c(colors[8 + 0],	colors[8 + 1],	colors[8 + 2],	colors[8 + 3]);
				tcu::Vec4 d(colors[12 + 0],	colors[12 + 1],	colors[12 + 2],	colors[12 + 3]);


				tcu::Vec4 color;

				if (isUpper)
					color = a * (1.0f - t)  + b * (t - s) + s * c;
				else
					color = a * (1.0f - s)  + d * (s - t) + t * c;

				int red		= deClamp32((int)(255.0f * color.x()), 0, 255);
				int green	= deClamp32((int)(255.0f * color.y()), 0, 255);
				int blue	= deClamp32((int)(255.0f * color.z()), 0, 255);
				int alpha	= deClamp32((int)(255.0f * color.w()), 0, 255);

				reference->setPixel(x, y, tcu::RGBA(red, green, blue, alpha));
			}
		}
	}
}